

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

void __thiscall CProficiencies::WriteProfs(CProficiencies *this,void *vfp)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  fprintf((FILE *)vfp,"ProfPoints %d %ld\n",(ulong)(uint)this->points,this->pawardedtime);
  if ((long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    lVar3 = ((long)prof_table.
                   super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)prof_table.
                   super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar1 = 2;
    lVar2 = 0;
    do {
      if (-1 < this->profs[lVar2]) {
        fprintf((FILE *)vfp,"Prof %s~ %d\n",
                *(undefined8 *)
                 ((long)&(prof_table.
                          super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                          _M_impl.super__Vector_impl_data._M_start)->ppsn + lVar1 * 4));
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 10;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar2);
  }
  return;
}

Assistant:

void CProficiencies::WriteProfs(void *vfp)
{
	FILE *fp = static_cast<FILE *>(vfp);
	fprintf(fp,"ProfPoints %d %ld\n", points, pawardedtime);

	auto prof_table_size = std::size(prof_table);
	for (int i = 0; i < prof_table_size; i++)
	{
		if (profs[i] > -1)
			fprintf(fp, "Prof %s~ %d\n", prof_table[i].name, profs[i]);
	}
}